

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Vector3 * __thiscall
stateObservation::kine::Orientation::operator*
          (Vector3 *__return_storage_ptr__,Orientation *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  char *__function;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  bVar5 = (this->q_).isSet_.b_;
  if ((bVar5 == false) && ((this->m_).isSet_.b_ == false)) {
    __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
  }
  if ((this->m_).isSet_.b_ == false) {
    if ((bVar5 == false) || ((this->q_).assertMsg_.b_ == (char *)0x0)) {
      __function = 
      "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
      ;
      goto LAB_001793dc;
    }
    dVar1 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[0];
    dVar2 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 8);
    dVar6 = dVar2 + dVar2;
    dVar3 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 0x10);
    dVar9 = dVar3 + dVar3;
    dVar4 = *(double *)
             ((long)(this->q_).v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 0x18);
    dVar8 = dVar1 * (dVar1 + dVar1);
    dVar7 = (dVar1 + dVar1) * dVar4;
    (this->m_).isSet_.b_ = true;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = 1.0 - (dVar6 * dVar2 + dVar9 * dVar3);
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = dVar1 * dVar6 + dVar4 * dVar9;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = dVar1 * dVar9 - dVar6 * dVar4;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = dVar1 * dVar6 - dVar4 * dVar9;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 1.0 - (dVar9 * dVar3 + dVar8);
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = dVar2 * dVar9 + dVar7;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = dVar1 * dVar9 + dVar6 * dVar4;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = dVar2 * dVar9 - dVar7;
    (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = 1.0 - (dVar6 * dVar2 + dVar8);
  }
  if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
    dVar1 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [0];
    dVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [1];
    dVar4 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[1];
    dVar6 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[4];
    dVar3 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [2];
    dVar7 = (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[7];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         dVar3 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[6] +
         dVar2 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[3] +
         dVar1 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar3 * dVar7 + dVar2 * dVar6 + dVar1 * dVar4;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         dVar3 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[8] +
         dVar2 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[5] +
         dVar1 * (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
    return __return_storage_ptr__;
  }
  __function = 
  "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
  ;
LAB_001793dc:
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline Vector3 Orientation::operator*(const Vector3 & v) const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_() * v;
}